

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_class_player.cpp
# Opt level: O2

void use_class_dota_player(void)

{
  bool bVar1;
  char *pcVar2;
  DotaPlayer dotaMe;
  DotaPlayer jan;
  DotaPlayer p2;
  DotaPlayer againMe;
  Player p3;
  Player p1;
  Player me;
  Player p4;
  
  std::__cxx11::string::string((string *)&jan,"Merlin",(allocator *)&dotaMe);
  L13_1::Player::Player(&me,(string *)&jan,false);
  std::__cxx11::string::~string((string *)&jan);
  std::__cxx11::string::string((string *)&dotaMe,"Jan",(allocator *)&againMe);
  L13_1::DotaPlayer::DotaPlayer(&jan,0x66,(string *)&dotaMe,true);
  std::__cxx11::string::~string((string *)&dotaMe);
  L13_1::Player::name(&jan.super_Player);
  bVar1 = L13_1::Player::is_playing(&jan.super_Player);
  pcVar2 = " is not playing currently.\n";
  if (bVar1) {
    pcVar2 = " is playing right now...\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
}

Assistant:

void use_class_dota_player() {
    using std::cout;
    using std::endl;
    using namespace L13_1;

    Player me("Merlin");
    DotaPlayer jan(102, "Jan", true);
    jan.name();
    if (jan.is_playing()) {
        cout << " is playing right now...\n";
    } else {
        cout << " is not playing currently.\n";
    }
    jan.name();
    cout << " played " << jan.get_game_played() << " games total.\n";

    //  initialize use "me"
    DotaPlayer dotaMe(1024, me);
    dotaMe.name();
    cout << " played " << dotaMe.get_game_played() << " games total.\n";

    //  隐式调用 “复制构造函数”
    DotaPlayer againMe(dotaMe);
    againMe.name();
    cout << " played " << againMe.get_game_played() << " games total.\n";

    Player p1("Zeal", true);
//    DotaPlayer * pp1 = &p1; // not allowed
//    DotaPlayer & rp1 = p1;  // not allowed

    DotaPlayer p2(242, p1);
    Player * pp2 = &p2; //  its ok
    pp2->name();

    //  甚至可以用子类去实例化基类...
    //  隐式构造函数
    Player p3(p2);
    //  隐式重载赋值运算符
    Player p4 = p2;
}